

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_bde.c
# Opt level: O0

err_t beltBDEDecr(void *dest,void *src,size_t count,octet *key,size_t len,octet *iv)

{
  bool_t bVar1;
  blob_t dest_00;
  void *in_RCX;
  ulong in_RDX;
  void *in_RSI;
  void *in_RDI;
  void *in_R8;
  octet *in_R9;
  void *state;
  octet *in_stack_ffffffffffffffb8;
  
  if ((((((in_RDX & 0xf) == 0) && (0xf < in_RDX)) &&
       ((in_R8 == (void *)0x10 || ((in_R8 == (void *)0x18 || (in_R8 == (void *)0x20)))))) &&
      (bVar1 = memIsValid(in_RSI,in_RDX), bVar1 != 0)) &&
     (((bVar1 = memIsValid(in_RCX,(size_t)in_R8), bVar1 != 0 &&
       (bVar1 = memIsValid(in_R9,0x10), bVar1 != 0)) &&
      (bVar1 = memIsValid(in_RDI,in_RDX), bVar1 != 0)))) {
    beltBDE_keep();
    dest_00 = blobCreate((size_t)in_stack_ffffffffffffffb8);
    if (dest_00 == (blob_t)0x0) {
      return 0x6e;
    }
    beltBDEStart(in_R8,in_R9,(size_t)dest_00,in_stack_ffffffffffffffb8);
    memMove(dest_00,in_stack_ffffffffffffffb8,0x148bfc);
    beltBDEStepD(in_R8,(size_t)in_R9,dest_00);
    blobClose((blob_t)0x148c1a);
    return 0;
  }
  return 0x6d;
}

Assistant:

err_t beltBDEDecr(void* dest, const void* src, size_t count,
	const octet key[], size_t len, const octet iv[16])
{
	void* state;
	// проверить входные данные
	if (count % 16 != 0 || count < 16 ||
		len != 16 && len != 24 && len != 32 ||
		!memIsValid(src, count) ||
		!memIsValid(key, len) ||
		!memIsValid(iv, 16) ||
		!memIsValid(dest, count))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(beltBDE_keep());
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// расшифровать
	beltBDEStart(state, key, len, iv);
	memMove(dest, src, count);
	beltBDEStepD(dest, count, state);
	// завершить
	blobClose(state);
	return ERR_OK;
}